

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O2

void build_scanners(Grammar *g)

{
  VecAction *v;
  ScanState **ppSVar1;
  VecScanStateTransition *av;
  byte bVar2;
  uint uVar3;
  int iVar4;
  State **ppSVar5;
  State *pSVar6;
  State *pSVar7;
  Action *pAVar8;
  Action **ppAVar9;
  Term *pTVar10;
  Action **ppAVar11;
  ScanState **ppSVar12;
  ScanState *pSVar13;
  Rule *pRVar14;
  char *pcVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int iVar18;
  uint uVar19;
  LexState *ls;
  ulong uVar20;
  NFAState *pNVar21;
  NFAState *pNVar22;
  NFAState *pNVar23;
  ushort **ppuVar24;
  __int32_t **pp_Var25;
  Action *trailing;
  DFAState *pDVar26;
  DFAState *x;
  ScanState *pSVar27;
  DFAState **ppDVar28;
  undefined1 *puVar29;
  ScanStateTransition *__ptr;
  ScanStateTransition *pSVar30;
  long lVar31;
  anon_struct_40_4_d8687ec6 *paVar32;
  NFAState **ppNVar33;
  NFAState **ppNVar34;
  Action **ppAVar35;
  uint i;
  undefined1 *puVar36;
  VecAction *pVVar37;
  Scanner *pSVar38;
  ulong uVar39;
  Scanner *pSVar40;
  anon_struct_40_4_d8687ec6_for_accepts *paVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  byte *pbVar45;
  ulong uVar46;
  NFAState **ppNVar47;
  bool bVar48;
  byte bVar49;
  ulong local_88;
  DFAState **ppDStack_80;
  DFAState *local_78 [3];
  anon_struct_40_4_d8687ec6_for_actions *local_60;
  anon_struct_40_4_d8687ec6 *local_58;
  NFAState **local_50;
  Action **local_48;
  ulong local_40;
  uint8 *local_38;
  
  bVar49 = 0;
  ls = (LexState *)calloc(1,0x40);
  uVar46 = (ulong)(g->states).n;
  for (uVar20 = 0; uVar20 != uVar46; uVar20 = uVar20 + 1) {
    ppSVar5 = (g->states).v;
    pSVar6 = ppSVar5[uVar20];
    if (pSVar6->same_shifts == (State *)0x0) {
      for (uVar39 = 0; uVar39 != uVar20; uVar39 = uVar39 + 1) {
        pSVar7 = ppSVar5[uVar39];
        if (((pSVar7->same_shifts == (State *)0x0) &&
            (uVar19 = (pSVar7->shift_actions).n, uVar19 == (pSVar6->shift_actions).n)) &&
           (((pSVar6->field_0x178 ^ pSVar7->field_0x178) & 0x38) == 0)) {
          uVar42 = 0;
          do {
            if (uVar19 == uVar42) {
              pSVar6->same_shifts = pSVar7;
              goto LAB_0013e072;
            }
            ppAVar11 = (pSVar6->shift_actions).v + uVar42;
            ppAVar9 = (pSVar7->shift_actions).v + uVar42;
            uVar42 = uVar42 + 1;
          } while ((*ppAVar11)->term == (*ppAVar9)->term);
        }
      }
    }
LAB_0013e072:
  }
  local_60 = &g->actions;
  local_48 = (g->actions).e;
  local_50 = (ls->allnfas).e;
  uVar19 = 0;
  uVar20 = 0;
  do {
    if (uVar46 <= uVar20) {
      if (d_verbose_level != 0) {
        printf("%d scanners %d transitions\n",(ulong)uVar19,(ulong)ls->transitions);
      }
      free(ls);
      return;
    }
    pSVar6 = (g->states).v[uVar20];
    if ((pSVar6->shift_actions).n != 0) {
      local_40 = uVar20;
      if (pSVar6->same_shifts == (State *)0x0) {
        pNVar21 = new_NFAState(ls);
        local_58 = pNVar21->chars;
        ppNVar47 = pNVar21->chars[0].e;
        bVar48 = false;
        for (uVar20 = 0; uVar46 = (ulong)(pSVar6->shift_actions).n, uVar20 < uVar46;
            uVar20 = uVar20 + 1) {
          pAVar8 = (pSVar6->shift_actions).v[uVar20];
          if (pAVar8->kind == ACTION_SHIFT) {
            pTVar10 = pAVar8->term;
            if (pTVar10->kind == TERM_STRING) {
              pbVar45 = (byte *)pTVar10->string;
              pNVar23 = pNVar21;
              if ((pTVar10->field_0x2c & 8) == 0) {
                for (; uVar46 = (ulong)*pbVar45, uVar46 != 0; pbVar45 = pbVar45 + 1) {
                  ppNVar34 = pNVar23->chars[uVar46].v;
                  if (pNVar23->chars[uVar46].n == 0) {
                    if (ppNVar34 == (NFAState **)0x0) {
                      pNVar22 = new_NFAState(ls);
                      bVar2 = *pbVar45;
                      pNVar23->chars[bVar2].v = pNVar23->chars[bVar2].e;
                      uVar19 = pNVar23->chars[*pbVar45].n;
                      pNVar23->chars[*pbVar45].n = uVar19 + 1;
                      pNVar23->chars[bVar2].e[uVar19] = pNVar22;
                    }
                    else {
                      pNVar22 = new_NFAState(ls);
                      if (ppNVar34 == pNVar23->chars[uVar46].e) {
                        bVar2 = *pbVar45;
                        ppNVar34 = pNVar23->chars[bVar2].v;
                        uVar19 = pNVar23->chars[bVar2].n;
                        pNVar23->chars[bVar2].n = uVar19 + 1;
                        ppNVar34[uVar19] = pNVar22;
                      }
                      else {
                        vec_add_internal(pNVar23->chars + uVar46,pNVar22);
                      }
                    }
                  }
                  else {
                    pNVar22 = *ppNVar34;
                  }
                  pNVar23 = pNVar22;
                }
              }
              else {
                for (; uVar46 = (ulong)*pbVar45, uVar46 != 0; pbVar45 = pbVar45 + 1) {
                  ppuVar24 = __ctype_b_loc();
                  if ((*(byte *)((long)*ppuVar24 + uVar46 * 2 + 1) & 4) == 0) {
                    ppNVar34 = pNVar23->chars[uVar46].v;
                    if (ppNVar34 == (NFAState **)0x0) {
                      pNVar22 = new_NFAState(ls);
                      bVar2 = *pbVar45;
                      pNVar23->chars[bVar2].v = pNVar23->chars[bVar2].e;
                      uVar19 = pNVar23->chars[*pbVar45].n;
                      pNVar23->chars[*pbVar45].n = uVar19 + 1;
                      pNVar23->chars[bVar2].e[uVar19] = pNVar22;
                    }
                    else {
                      paVar32 = pNVar23->chars + uVar46;
                      if (ppNVar34 == paVar32->e) {
                        if (2 < paVar32->n) goto LAB_0013e495;
                      }
                      else if ((paVar32->n & 7) == 0) {
LAB_0013e495:
                        pNVar22 = new_NFAState(ls);
                        goto LAB_0013e535;
                      }
                      pNVar22 = new_NFAState(ls);
                      bVar2 = *pbVar45;
                      ppNVar34 = pNVar23->chars[bVar2].v;
                      uVar19 = pNVar23->chars[bVar2].n;
                      pNVar23->chars[bVar2].n = uVar19 + 1;
                      ppNVar34[uVar19] = pNVar22;
                    }
                  }
                  else {
                    pp_Var25 = __ctype_toupper_loc();
                    ppNVar34 = pNVar23->chars[(*pp_Var25)[uVar46]].v;
                    if (ppNVar34 == (NFAState **)0x0) {
                      pNVar22 = new_NFAState(ls);
                      iVar18 = (*pp_Var25)[*pbVar45];
                      pNVar23->chars[iVar18].v = pNVar23->chars[iVar18].e;
                      uVar19 = pNVar23->chars[(*pp_Var25)[*pbVar45]].n;
                      pNVar23->chars[(*pp_Var25)[*pbVar45]].n = uVar19 + 1;
                      pNVar23->chars[iVar18].e[uVar19] = pNVar22;
                    }
                    else {
                      paVar32 = pNVar23->chars + (*pp_Var25)[uVar46];
                      if (ppNVar34 == paVar32->e) {
                        if (2 < paVar32->n) goto LAB_0013e4b6;
                      }
                      else if ((paVar32->n & 7) == 0) {
LAB_0013e4b6:
                        pNVar22 = new_NFAState(ls);
                        vec_add_internal(paVar32,pNVar22);
                        goto LAB_0013e4c9;
                      }
                      pNVar22 = new_NFAState(ls);
                      iVar18 = (*pp_Var25)[*pbVar45];
                      ppNVar34 = pNVar23->chars[iVar18].v;
                      uVar19 = pNVar23->chars[iVar18].n;
                      pNVar23->chars[iVar18].n = uVar19 + 1;
                      ppNVar34[uVar19] = pNVar22;
                    }
LAB_0013e4c9:
                    pp_Var25 = __ctype_tolower_loc();
                    iVar18 = (*pp_Var25)[*pbVar45];
                    paVar32 = pNVar23->chars + iVar18;
                    ppNVar33 = pNVar23->chars[iVar18].e;
                    ppNVar34 = pNVar23->chars[iVar18].v;
                    if (ppNVar34 == (NFAState **)0x0) {
                      paVar32->v = ppNVar33;
                      uVar19 = pNVar23->chars[(*pp_Var25)[*pbVar45]].n;
                      pNVar23->chars[(*pp_Var25)[*pbVar45]].n = uVar19 + 1;
                      paVar32->e[uVar19] = pNVar22;
                    }
                    else {
                      uVar19 = paVar32->n;
                      if (ppNVar34 == ppNVar33) {
                        if (uVar19 < 3) goto LAB_0013e4fe;
                      }
                      else if ((uVar19 & 7) != 0) {
LAB_0013e4fe:
                        paVar32->n = uVar19 + 1;
                        ppNVar34[uVar19] = pNVar22;
                        goto LAB_0013e53a;
                      }
LAB_0013e535:
                      vec_add_internal(paVar32,pNVar22);
                    }
                  }
LAB_0013e53a:
                  pNVar23 = pNVar22;
                }
              }
              ppAVar9 = (pNVar23->accepts).v;
              ppAVar11 = (pNVar23->accepts).e;
              if (ppAVar9 == (Action **)0x0) {
                (pNVar23->accepts).v = ppAVar11;
                uVar19 = (pNVar23->accepts).n;
                (pNVar23->accepts).n = uVar19 + 1;
                (pNVar23->accepts).e[uVar19] = pAVar8;
                goto LAB_0013e5f3;
              }
              paVar41 = &pNVar23->accepts;
              uVar19 = paVar41->n;
              if (ppAVar9 == ppAVar11) {
                if (uVar19 < 3) goto LAB_0013e574;
              }
              else if ((uVar19 & 7) != 0) {
LAB_0013e574:
                paVar41->n = uVar19 + 1;
                ppAVar9[uVar19] = pAVar8;
                goto LAB_0013e5f3;
              }
              goto LAB_0013e5ee;
            }
          }
          else if (pAVar8->kind == ACTION_ACCEPT) {
            ppNVar34 = pNVar21->chars[0].v;
            if (pNVar21->chars[0].n == 0) {
              if (ppNVar34 == (NFAState **)0x0) {
                pNVar23 = new_NFAState(ls);
                pNVar21->chars[0].v = ppNVar47;
                uVar19 = pNVar21->chars[0].n;
                pNVar21->chars[0].n = uVar19 + 1;
                pNVar21->chars[0].e[uVar19] = pNVar23;
              }
              else {
                pNVar23 = new_NFAState(ls);
                if (ppNVar34 == ppNVar47) {
                  uVar19 = pNVar21->chars[0].n;
                  pNVar21->chars[0].n = uVar19 + 1;
                  pNVar21->chars[0].v[uVar19] = pNVar23;
                }
                else {
                  vec_add_internal(local_58,pNVar23);
                }
              }
            }
            else {
              pNVar23 = *ppNVar34;
            }
            ppAVar9 = (pNVar23->accepts).v;
            ppAVar11 = (pNVar23->accepts).e;
            if (ppAVar9 == (Action **)0x0) {
              (pNVar23->accepts).v = ppAVar11;
              uVar19 = (pNVar23->accepts).n;
              (pNVar23->accepts).n = uVar19 + 1;
              (pNVar23->accepts).e[uVar19] = pAVar8;
            }
            else {
              paVar41 = &pNVar23->accepts;
              uVar19 = paVar41->n;
              if (ppAVar9 == ppAVar11) {
                if (2 < uVar19) goto LAB_0013e5ee;
              }
              else if ((uVar19 & 7) == 0) {
LAB_0013e5ee:
                vec_add_internal(paVar41,pAVar8);
                goto LAB_0013e5f3;
              }
              paVar41->n = uVar19 + 1;
              ppAVar9[uVar19] = pAVar8;
            }
LAB_0013e5f3:
            bVar48 = true;
          }
        }
        ppNVar47 = (pNVar21->epsilon).e;
        for (uVar20 = 0; uVar20 < uVar46; uVar20 = uVar20 + 1) {
          pAVar8 = (pSVar6->shift_actions).v[uVar20];
          if ((pAVar8->kind == ACTION_SHIFT) && (pAVar8->term->kind == TERM_REGEX)) {
            trailing = (Action *)malloc(0x30);
            uVar16 = *(undefined4 *)&pAVar8->field_0x4;
            pTVar10 = pAVar8->term;
            pRVar14 = pAVar8->rule;
            pSVar7 = pAVar8->state;
            uVar3 = pAVar8->index;
            uVar17 = *(undefined4 *)&pAVar8->field_0x24;
            pcVar15 = pAVar8->temp_string;
            trailing->kind = pAVar8->kind;
            *(undefined4 *)&trailing->field_0x4 = uVar16;
            trailing->term = pTVar10;
            trailing->rule = pRVar14;
            trailing->state = pSVar7;
            trailing->index = uVar3;
            *(undefined4 *)&trailing->field_0x24 = uVar17;
            trailing->temp_string = pcVar15;
            trailing->kind = ACTION_SHIFT_TRAILING;
            uVar3 = g->action_count;
            g->action_count = uVar3 + 1;
            trailing->index = uVar3;
            local_38 = (uint8 *)pAVar8->term->string;
            ppNVar34 = (pNVar21->epsilon).v;
            if (ppNVar34 == (NFAState **)0x0) {
              pNVar23 = new_NFAState(ls);
              (pNVar21->epsilon).v = ppNVar47;
              uVar19 = (pNVar21->epsilon).n;
              (pNVar21->epsilon).n = uVar19 + 1;
              (pNVar21->epsilon).e[uVar19] = pNVar23;
            }
            else {
              uVar19 = (pNVar21->epsilon).n;
              if (ppNVar34 == ppNVar47) {
                if (2 < uVar19) goto LAB_0013e72c;
              }
              else if ((uVar19 & 7) == 0) {
LAB_0013e72c:
                pNVar23 = new_NFAState(ls);
                vec_add_internal(&pNVar21->epsilon,pNVar23);
                goto LAB_0013e749;
              }
              pNVar23 = new_NFAState(ls);
              uVar19 = (pNVar21->epsilon).n;
              (pNVar21->epsilon).n = uVar19 + 1;
              (pNVar21->epsilon).v[uVar19] = pNVar23;
            }
LAB_0013e749:
            pNVar22 = new_NFAState(ls);
            ls->ignore_case = *(uint *)&pAVar8->term->field_0x2c >> 3 & 1;
            iVar18 = build_regex_nfa(ls,&local_38,pNVar23,pNVar22,trailing);
            if (iVar18 == 0) {
              free(trailing);
            }
            else {
              puVar36 = &pAVar8->term->field_0x2c;
              *puVar36 = *puVar36 | 0x10;
              pSVar6->field_0x178 = pSVar6->field_0x178 | 0x40;
              ppAVar11 = (g->actions).v;
              if (ppAVar11 == (Action **)0x0) {
                (g->actions).v = local_48;
                uVar19 = (g->actions).n;
                (g->actions).n = uVar19 + 1;
                (g->actions).e[uVar19] = trailing;
              }
              else {
                uVar19 = local_60->n;
                if (ppAVar11 == local_48) {
                  if (2 < uVar19) goto LAB_0013e804;
                }
                else if ((uVar19 & 7) == 0) {
LAB_0013e804:
                  vec_add_internal(local_60,trailing);
                  goto LAB_0013e811;
                }
                local_60->n = uVar19 + 1;
                ppAVar11[uVar19] = trailing;
              }
            }
LAB_0013e811:
            ppAVar9 = (pNVar22->accepts).v;
            ppAVar11 = (pNVar22->accepts).e;
            if (ppAVar9 == (Action **)0x0) {
              (pNVar22->accepts).v = ppAVar11;
              uVar19 = (pNVar22->accepts).n;
              (pNVar22->accepts).n = uVar19 + 1;
              (pNVar22->accepts).e[uVar19] = pAVar8;
            }
            else {
              paVar41 = &pNVar22->accepts;
              uVar19 = paVar41->n;
              if (ppAVar9 == ppAVar11) {
                if (2 < uVar19) goto LAB_0013e867;
              }
              else if ((uVar19 & 7) == 0) {
LAB_0013e867:
                vec_add_internal(paVar41,pAVar8);
                goto LAB_0013e872;
              }
              paVar41->n = uVar19 + 1;
              ppAVar9[uVar19] = pAVar8;
            }
LAB_0013e872:
            bVar48 = true;
          }
          uVar46 = (ulong)(pSVar6->shift_actions).n;
        }
        if (bVar48) {
          pDVar26 = new_DFAState();
          local_78[0] = (DFAState *)0x0;
          local_78[1] = (DFAState *)0x0;
          local_88 = 0;
          ppDStack_80 = (DFAState **)0x0;
          local_78[2] = (DFAState *)0x0;
          ppNVar47 = (pDVar26->states).v;
          ppNVar34 = (pDVar26->states).e;
          if (ppNVar47 == (NFAState **)0x0) {
            (pDVar26->states).v = ppNVar34;
            uVar19 = (pDVar26->states).n;
            (pDVar26->states).n = uVar19 + 1;
            (pDVar26->states).e[uVar19] = pNVar21;
          }
          else {
            uVar19 = (pDVar26->states).n;
            if (ppNVar47 == ppNVar34) {
              if (2 < uVar19) goto LAB_0013e8f7;
            }
            else if ((uVar19 & 7) == 0) {
LAB_0013e8f7:
              vec_add_internal(pDVar26,pNVar21);
              goto LAB_0013e904;
            }
            (pDVar26->states).n = uVar19 + 1;
            ppNVar47[uVar19] = pNVar21;
          }
LAB_0013e904:
          pSVar38 = &pSVar6->scanner;
          nfa_closure(pDVar26);
          ppDStack_80 = local_78;
          local_88 = CONCAT44(local_88._4_4_,1);
          uVar46 = 1;
          local_78[0] = pDVar26;
          for (uVar20 = 0; uVar20 < uVar46; uVar20 = uVar20 + 1) {
            pDVar26 = ppDStack_80[uVar20];
            for (lVar31 = 0; lVar31 != 0x100; lVar31 = lVar31 + 1) {
              x = (DFAState *)0x0;
              for (uVar46 = 0; uVar46 < (pDVar26->states).n; uVar46 = uVar46 + 1) {
                uVar39 = 0;
                while( true ) {
                  pNVar21 = (pDVar26->states).v[uVar46];
                  if (pNVar21->chars[lVar31].n <= uVar39) break;
                  if (x == (DFAState *)0x0) {
                    x = new_DFAState();
                  }
                  set_add(x,pNVar21->chars[lVar31].v[uVar39]);
                  uVar39 = uVar39 + 1;
                }
              }
              if (x != (DFAState *)0x0) {
                set_to_vec(x);
                nfa_closure(x);
                uVar46 = local_88 & 0xffffffff;
                for (uVar39 = 0; uVar39 != uVar46; uVar39 = uVar39 + 1) {
                  uVar19 = (x->states).n;
                  if (uVar19 == (ppDStack_80[uVar39]->states).n) {
                    uVar42 = 0;
                    do {
                      if (uVar19 == uVar42) {
                        free_DFAState(x);
                        x = ppDStack_80[uVar39];
                        goto LAB_0013ea26;
                      }
                      ppNVar47 = (x->states).v + uVar42;
                      ppNVar34 = (ppDStack_80[uVar39]->states).v + uVar42;
                      uVar42 = uVar42 + 1;
                    } while (*ppNVar47 == *ppNVar34);
                  }
                }
                if (ppDStack_80 == (DFAState **)0x0) {
                  ppDStack_80 = local_78;
                  local_88 = CONCAT44(local_88._4_4_,(uint)local_88 + 1);
                  local_78[uVar46] = x;
                }
                else {
                  if (ppDStack_80 == local_78) {
                    if (2 < (uint)local_88) goto LAB_0013ea75;
                  }
                  else if ((local_88 & 7) == 0) {
LAB_0013ea75:
                    vec_add_internal(&local_88,x);
                    goto LAB_0013ea26;
                  }
                  local_88 = CONCAT44(local_88._4_4_,(uint)local_88 + 1);
                  ppDStack_80[uVar46] = x;
                }
LAB_0013ea26:
                pDVar26->chars[lVar31] = x;
              }
            }
            uVar46 = local_88 & 0xffffffff;
          }
          (pSVar6->scanner).states.n = 0;
          (pSVar6->scanner).states.v = (ScanState **)0x0;
          ppSVar1 = (pSVar6->scanner).states.e;
          for (uVar20 = 0; uVar20 < uVar46; uVar20 = uVar20 + 1) {
            pSVar27 = (ScanState *)calloc(1,0x1058);
            ppDStack_80[uVar20]->scan = pSVar27;
            pSVar27 = ppDStack_80[uVar20]->scan;
            pSVar27->index = (uint)uVar20;
            ppSVar12 = (pSVar6->scanner).states.v;
            if (ppSVar12 == (ScanState **)0x0) {
              (pSVar6->scanner).states.v = ppSVar1;
              uVar19 = (pSVar6->scanner).states.n;
              (pSVar6->scanner).states.n = uVar19 + 1;
              (pSVar6->scanner).states.e[uVar19] = pSVar27;
            }
            else {
              uVar19 = (pSVar38->states).n;
              if (ppSVar12 == ppSVar1) {
                if (2 < uVar19) goto LAB_0013eb44;
              }
              else if ((uVar19 & 7) == 0) {
LAB_0013eb44:
                vec_add_internal(pSVar38,pSVar27);
                uVar46 = local_88 & 0xffffffff;
                goto LAB_0013eb52;
              }
              (pSVar38->states).n = uVar19 + 1;
              ppSVar12[uVar19] = pSVar27;
            }
LAB_0013eb52:
          }
          for (uVar20 = 0; uVar20 < uVar46; uVar20 = uVar20 + 1) {
            for (lVar31 = 0; pDVar26 = ppDStack_80[uVar20], lVar31 != 0x100; lVar31 = lVar31 + 1) {
              if (pDVar26->chars[lVar31] != (DFAState *)0x0) {
                pDVar26->scan->chars[lVar31] = pDVar26->chars[lVar31]->scan;
              }
            }
            uVar46 = (ulong)(pDVar26->states).n;
            iVar18 = -0x80000000;
            for (uVar39 = 0; uVar39 != uVar46; uVar39 = uVar39 + 1) {
              pNVar21 = (pDVar26->states).v[uVar39];
              for (uVar42 = 0; (pNVar21->accepts).n != uVar42; uVar42 = uVar42 + 1) {
                iVar4 = (pNVar21->accepts).v[uVar42]->term->term_priority;
                if (iVar18 <= iVar4) {
                  iVar18 = iVar4;
                }
              }
            }
            ppDVar28 = ppDStack_80;
            for (uVar39 = 0; uVar39 < uVar46; uVar39 = uVar39 + 1) {
              for (uVar46 = 0; pNVar21 = (pDVar26->states).v[uVar39], uVar46 < (pNVar21->accepts).n;
                  uVar46 = uVar46 + 1) {
                pAVar8 = (pNVar21->accepts).v[uVar46];
                if (pAVar8->term->term_priority == iVar18) {
                  pSVar27 = pDVar26->scan;
                  ppAVar9 = (pSVar27->accepts).v;
                  ppAVar11 = (pSVar27->accepts).e;
                  if (ppAVar9 == (Action **)0x0) {
                    (pSVar27->accepts).v = ppAVar11;
                    uVar19 = (ppDVar28[uVar20]->scan->accepts).n;
                    (ppDVar28[uVar20]->scan->accepts).n = uVar19 + 1;
                    (pSVar27->accepts).e[uVar19] = pAVar8;
                  }
                  else {
                    pVVar37 = &pSVar27->accepts;
                    uVar19 = pVVar37->n;
                    if (ppAVar9 == ppAVar11) {
                      if (2 < uVar19) goto LAB_0013ec89;
                    }
                    else if ((uVar19 & 7) == 0) {
LAB_0013ec89:
                      vec_add_internal(pVVar37,pAVar8);
                      goto LAB_0013ec8e;
                    }
                    pVVar37->n = uVar19 + 1;
                    ppAVar9[uVar19] = pAVar8;
                  }
                }
LAB_0013ec8e:
                pDVar26 = ppDStack_80[uVar20];
                ppDVar28 = ppDStack_80;
              }
              uVar46 = (ulong)(pDVar26->states).n;
            }
            uVar46 = local_88 & 0xffffffff;
          }
          for (uVar20 = 0; uVar20 < uVar46; uVar20 = uVar20 + 1) {
            free_DFAState(ppDStack_80[uVar20]);
            uVar46 = local_88 & 0xffffffff;
          }
          if (ppDStack_80 != local_78 && ppDStack_80 != (DFAState **)0x0) {
            free(ppDStack_80);
          }
          for (puVar36 = (undefined1 *)0x0; puVar29 = (undefined1 *)(ulong)(pSVar38->states).n,
              puVar36 < puVar29; puVar36 = puVar36 + 1) {
            pSVar27 = (pSVar6->scanner).states.v[(long)puVar36];
            set_union(&pSVar27->live,&pSVar27->accepts);
          }
          bVar48 = true;
          while (puVar36 = (undefined1 *)0x0, bVar48) {
            bVar48 = false;
            for (; puVar36 < puVar29; puVar36 = puVar36 + 1) {
              pSVar27 = (pSVar6->scanner).states.v[(long)puVar36];
              for (lVar31 = 1; lVar31 != 0x101; lVar31 = lVar31 + 1) {
                pSVar13 = pSVar27->chars[lVar31 + -1];
                if ((pSVar27 != pSVar13 && pSVar13 != (ScanState *)0x0) &&
                   (iVar18 = set_union(&pSVar27->live,&pSVar13->live), iVar18 != 0)) {
                  bVar48 = true;
                }
              }
              puVar29 = (undefined1 *)(ulong)(pSVar38->states).n;
            }
          }
          for (; puVar36 < puVar29; puVar36 = puVar36 + 1) {
            pVVar37 = &(pSVar6->scanner).states.v[(long)puVar36]->live;
            set_to_vec(pVVar37);
            sort_VecAction(pVVar37);
            puVar29 = (undefined1 *)(ulong)(pSVar6->scanner).states.n;
          }
          trans_hash_fns.data[0] = (void *)0x1;
          av = &(pSVar6->scanner).transitions;
          __ptr = (ScanStateTransition *)0x0;
          paVar32 = (anon_struct_40_4_d8687ec6 *)0x0;
          while (paVar32 < puVar29) {
            pSVar27 = (pSVar6->scanner).states.v[(long)paVar32];
            local_58 = paVar32;
            for (lVar31 = 0; lVar31 != 0x100; lVar31 = lVar31 + 1) {
              if (__ptr == (ScanStateTransition *)0x0) {
                __ptr = (ScanStateTransition *)calloc(1,0x58);
              }
              pSVar13 = pSVar27->chars[lVar31];
              if (pSVar13 != (ScanState *)0x0) {
                pVVar37 = &__ptr->live_diff;
                ppAVar11 = (__ptr->live_diff).e;
                uVar19 = (pSVar27->live).n;
                uVar44 = 0;
                uVar20 = 0;
LAB_0013ee62:
                if (uVar44 < uVar19) {
                  for (uVar20 = uVar20 & 0xffffffff; uVar20 < (pSVar13->live).n; uVar20 = uVar20 + 1
                      ) {
                    while( true ) {
                      pAVar8 = (pSVar27->live).v[uVar44];
                      uVar43 = (pSVar13->live).v[uVar20]->index;
                      if (pAVar8->index == uVar43) {
                        uVar44 = uVar44 + 1;
                        uVar20 = uVar20 + 1;
                        goto LAB_0013ee62;
                      }
                      if (uVar43 <= pAVar8->index) break;
                      ppAVar9 = (__ptr->live_diff).v;
                      if (ppAVar9 == (Action **)0x0) {
                        (__ptr->live_diff).v = ppAVar11;
                        uVar19 = (__ptr->live_diff).n;
                        (__ptr->live_diff).n = uVar19 + 1;
                        (__ptr->live_diff).e[uVar19] = pAVar8;
                      }
                      else {
                        uVar19 = pVVar37->n;
                        if (ppAVar9 == ppAVar11) {
                          if (2 < uVar19) goto LAB_0013eedc;
                        }
                        else if ((uVar19 & 7) == 0) {
LAB_0013eedc:
                          vec_add_internal(pVVar37,pAVar8);
                          goto LAB_0013eee6;
                        }
                        pVVar37->n = uVar19 + 1;
                        ppAVar9[uVar19] = pAVar8;
                      }
LAB_0013eee6:
                      uVar44 = uVar44 + 1;
                      uVar19 = (pSVar27->live).n;
                      if (uVar19 <= uVar44) goto LAB_0013ef87;
                    }
                  }
                  uVar20 = (ulong)uVar44;
                  goto LAB_0013ef10;
                }
LAB_0013ef87:
                v = &__ptr->accepts_diff;
                ppAVar11 = (__ptr->accepts_diff).e;
                uVar20 = 0;
                uVar46 = 0;
LAB_0013ef95:
                uVar19 = (pSVar27->accepts).n;
                if ((uint)uVar20 < uVar19) {
                  uVar46 = uVar46 & 0xffffffff;
LAB_0013efaa:
                  if (uVar46 < pVVar37->n) {
                    uVar44 = (__ptr->live_diff).v[uVar46]->index;
                    do {
                      pAVar8 = (pSVar27->accepts).v[uVar20];
                      if (pAVar8->index == uVar44) {
                        ppAVar9 = (__ptr->accepts_diff).v;
                        if (ppAVar9 == (Action **)0x0) {
                          (__ptr->accepts_diff).v = ppAVar11;
                          uVar19 = (__ptr->accepts_diff).n;
                          (__ptr->accepts_diff).n = uVar19 + 1;
                          (__ptr->accepts_diff).e[uVar19] = pAVar8;
                        }
                        else {
                          uVar19 = v->n;
                          if (ppAVar9 == ppAVar11) {
                            if (2 < uVar19) goto LAB_0013f01f;
                          }
                          else if ((uVar19 & 7) == 0) {
LAB_0013f01f:
                            vec_add_internal(v,pAVar8);
                            goto LAB_0013f02c;
                          }
                          v->n = uVar19 + 1;
                          ppAVar9[uVar19] = pAVar8;
                        }
LAB_0013f02c:
                        uVar20 = (ulong)((int)uVar20 + 1);
                        uVar46 = uVar46 + 1;
                        goto LAB_0013ef95;
                      }
                      if (uVar44 <= pAVar8->index) goto LAB_0013efdf;
                      uVar43 = (int)uVar20 + 1;
                      uVar20 = (ulong)uVar43;
                      if (uVar19 <= uVar43) break;
                    } while( true );
                  }
                }
              }
              pSVar30 = (ScanStateTransition *)set_add_fn(av,__ptr,&trans_hash_fns);
              if (pSVar30 == __ptr) {
                __ptr = (ScanStateTransition *)0x0;
              }
              else {
                ppAVar11 = (__ptr->live_diff).v;
                if (ppAVar11 != (__ptr->live_diff).e && ppAVar11 != (Action **)0x0) {
                  free(ppAVar11);
                }
                (__ptr->live_diff).n = 0;
                (__ptr->live_diff).v = (Action **)0x0;
                ppAVar11 = (__ptr->accepts_diff).v;
                if (ppAVar11 != (__ptr->accepts_diff).e && ppAVar11 != (Action **)0x0) {
                  free(ppAVar11);
                }
                (__ptr->accepts_diff).n = 0;
                (__ptr->accepts_diff).v = (Action **)0x0;
              }
              pSVar27->transition[lVar31] = pSVar30;
            }
            puVar29 = (undefined1 *)(ulong)(pSVar38->states).n;
            paVar32 = (anon_struct_40_4_d8687ec6 *)((long)&local_58->n + 1);
          }
          free(__ptr);
          set_to_vec(av);
          uVar19 = (pSVar6->scanner).transitions.n;
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            (pSVar6->scanner).transitions.v[uVar20]->index = (uint)uVar20;
          }
          ls->transitions = ls->transitions + uVar19;
        }
        for (uVar20 = 0; ppNVar47 = (ls->allnfas).v, uVar20 < (ls->allnfas).n; uVar20 = uVar20 + 1)
        {
          pNVar21 = ppNVar47[uVar20];
          ppNVar47 = pNVar21->chars[0].e;
          lVar31 = 0x100;
          while (bVar48 = lVar31 != 0, lVar31 = lVar31 + -1, bVar48) {
            ppNVar34 = (NFAState **)ppNVar47[-1];
            if (ppNVar47 != ppNVar34 && ppNVar34 != (NFAState **)0x0) {
              free(ppNVar34);
            }
            ((anon_struct_40_4_d8687ec6 *)(ppNVar47 + -2))->n = 0;
            ppNVar47[-1] = (NFAState *)0x0;
            ppNVar47 = ppNVar47 + 5;
          }
          ppNVar47 = (pNVar21->epsilon).v;
          if (ppNVar47 != (pNVar21->epsilon).e && ppNVar47 != (NFAState **)0x0) {
            free(ppNVar47);
          }
          (pNVar21->epsilon).n = 0;
          (pNVar21->epsilon).v = (NFAState **)0x0;
          ppAVar11 = (pNVar21->accepts).v;
          if (ppAVar11 != (pNVar21->accepts).e && ppAVar11 != (Action **)0x0) {
            free(ppAVar11);
          }
          free(pNVar21);
        }
        if (ppNVar47 != local_50 && ppNVar47 != (NFAState **)0x0) {
          free(ppNVar47);
        }
        (ls->allnfas).n = 0;
        (ls->allnfas).v = (NFAState **)0x0;
        uVar19 = ls->scanners + 1;
        ls->scanners = uVar19;
        uVar20 = local_40;
      }
      else {
        pSVar38 = &pSVar6->same_shifts->scanner;
        pSVar40 = &pSVar6->scanner;
        for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
          uVar3 = (pSVar38->states).i;
          (pSVar40->states).n = (pSVar38->states).n;
          (pSVar40->states).i = uVar3;
          pSVar38 = (Scanner *)((long)pSVar38 + (ulong)bVar49 * -0x10 + 8);
          pSVar40 = (Scanner *)((long)pSVar40 + (ulong)bVar49 * -0x10 + 8);
        }
      }
    }
    uVar20 = uVar20 + 1;
    uVar46 = (ulong)(g->states).n;
  } while( true );
LAB_0013ef10:
  if (uVar19 <= uVar20) goto LAB_0013ef87;
  ppAVar9 = (__ptr->live_diff).v;
  if (ppAVar9 == (Action **)0x0) {
    pAVar8 = (pSVar27->live).v[uVar20];
    (__ptr->live_diff).v = ppAVar11;
    uVar19 = (__ptr->live_diff).n;
    (__ptr->live_diff).n = uVar19 + 1;
    (__ptr->live_diff).e[uVar19] = pAVar8;
  }
  else {
    uVar19 = pVVar37->n;
    if (ppAVar9 == ppAVar11) {
      ppAVar35 = (pSVar27->live).v;
      if (2 < uVar19) goto LAB_0013ef6d;
    }
    else {
      ppAVar35 = (pSVar27->live).v;
      if ((uVar19 & 7) == 0) {
LAB_0013ef6d:
        vec_add_internal(pVVar37,ppAVar35[uVar20]);
        goto LAB_0013ef7b;
      }
    }
    pAVar8 = ppAVar35[uVar20];
    pVVar37->n = uVar19 + 1;
    ppAVar9[uVar19] = pAVar8;
  }
LAB_0013ef7b:
  uVar20 = uVar20 + 1;
  uVar19 = (pSVar27->live).n;
  goto LAB_0013ef10;
LAB_0013efdf:
  uVar46 = uVar46 + 1;
  goto LAB_0013efaa;
}

Assistant:

void build_scanners(Grammar *g) {
  uint i, j, k;
  State *s;
  LexState *ls = new_LexState();

  /* detect identical scanners */
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->same_shifts) continue;
    for (j = 0; j < i; j++) {
      if (g->states.v[j]->same_shifts) continue;
      if (g->states.v[j]->shift_actions.n != s->shift_actions.n) continue;
      if (g->states.v[j]->scan_kind != s->scan_kind) continue;
      for (k = 0; k < g->states.v[j]->shift_actions.n; k++)
        if (s->shift_actions.v[k]->term != g->states.v[j]->shift_actions.v[k]->term) break;
      if (k >= g->states.v[j]->shift_actions.n) {
        s->same_shifts = g->states.v[j];
        break;
      }
    }
  }
  /* build scanners */
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->shift_actions.n) {
      if (s->same_shifts)
        s->scanner = s->same_shifts->scanner;
      else
        build_state_scanner(g, ls, s);
    }
  }
  if (d_verbose_level) printf("%d scanners %d transitions\n", ls->scanners, ls->transitions);
  FREE(ls);
}